

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc)

{
  st_ptls_get_time_t *psVar1;
  st_ptls_encrypt_ticket_t *psVar2;
  ptls_context_t *ppVar3;
  char *pcVar4;
  ptls_key_exchange_algorithm_t *ppVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ptls_key_exchange_algorithm_t **pppVar9;
  ulong uVar10;
  size_t sVar11;
  ptls_key_schedule_t *sched;
  ptls_hash_context_t **pppVar12;
  ptls_iovec_t pVar13;
  ptls_iovec_t ikm;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  char *local_248;
  ptls_key_schedule_t *local_240;
  int *local_238;
  uint32_t age_add;
  ptls_buffer_t decbuf;
  uint64_t issue_at;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t ticket_psk;
  uint8_t verify_data [64];
  uint8_t binder_key [64];
  uint8_t decbuf_small [256];
  
  psVar1 = tls->ctx->get_time;
  local_238 = accept_early_data;
  local_240 = (ptls_key_schedule_t *)(*psVar1->cb)(psVar1);
  decbuf.base = decbuf_small;
  decbuf.off = 0;
  decbuf.capacity = 0x100;
  decbuf._24_8_ = (ulong)(uint)decbuf._28_4_ << 0x20;
  *psk_index = 0;
  if ((ch->psk).identities.count != 0) {
    uVar8 = 0;
    do {
      decbuf.off = 0;
      psVar2 = tls->ctx->encrypt_ticket;
      pVar13.len = (ch->psk).identities.list[uVar8].identity.len;
      pVar13.base = (ch->psk).identities.list[uVar8].identity.base;
      iVar6 = (*psVar2->cb)(psVar2,tls,0,&decbuf,pVar13);
      if ((((iVar6 == 0) &&
           (iVar6 = decode_session_identifier
                              (&issue_at,&ticket_psk,&age_add,&ticket_server_name,
                               &ticket_key_exchange_id,&ticket_csid,&ticket_negotiated_protocol,
                               decbuf.base,decbuf.base + decbuf.off), iVar6 == 0)) &&
          (issue_at <= local_240)) &&
         (ppVar3 = tls->ctx, (long)local_240 - issue_at <= (ulong)ppVar3->ticket_lifetime * 1000)) {
        *local_238 = 0;
        if ((ch->psk).early_data_indication != 0) {
          uVar10 = (long)local_240 -
                   (issue_at + ((ch->psk).identities.list[uVar8].obfuscated_ticket_age - age_add));
          uVar8 = -uVar10;
          if (0 < (long)uVar10) {
            uVar8 = uVar10;
          }
          if (uVar8 < 0x2711) {
            *local_238 = 1;
          }
        }
        pcVar4 = tls->server_name;
        if (ticket_server_name.len == 0) {
          if (pcVar4 == (char *)0x0) {
LAB_00113bc3:
            sVar11 = ticket_negotiated_protocol.len;
            pppVar9 = ppVar3->key_exchanges;
            ppVar5 = *pppVar9;
            while (ppVar5 != (ptls_key_exchange_algorithm_t *)0x0) {
              pppVar9 = pppVar9 + 1;
              if (ppVar5->id == ticket_key_exchange_id) {
                tls->key_share = ppVar5;
                if ((ticket_csid == tls->cipher_suite->id) &&
                   (((ticket_negotiated_protocol.len == 0 ||
                     (((pcVar4 = tls->negotiated_protocol, pcVar4 != (char *)0x0 &&
                       (local_248 = pcVar4,
                       iVar6 = strncmp((char *)ticket_negotiated_protocol.base,pcVar4,
                                       ticket_negotiated_protocol.len), iVar6 == 0)) &&
                      (local_248[sVar11] == '\0')))) &&
                    ((ticket_psk.len == (tls->key_schedule->hashes[0].algo)->digest_size &&
                     ((ch->psk).identities.list[*psk_index].binder.len == ticket_psk.len)))))) {
                  ikm.len = ticket_psk.len;
                  ikm.base = ticket_psk.base;
                  iVar6 = key_schedule_extract(tls->key_schedule,ikm);
                  if ((iVar6 == 0) &&
                     (iVar6 = derive_secret(tls->key_schedule,binder_key,"res binder"), iVar6 == 0))
                  {
                    sched = tls->key_schedule;
                    if (sched->num_hashes != 0) {
                      pppVar12 = &sched->hashes[0].ctx;
                      sVar11 = 0;
                      local_240 = sched;
                      do {
                        (*(*pppVar12)->update)(*pppVar12,ch_trunc.base,ch_trunc.len);
                        sVar11 = sVar11 + 1;
                        pppVar12 = pppVar12 + 2;
                      } while (sVar11 != local_240->num_hashes);
                      sched = tls->key_schedule;
                    }
                    iVar6 = calc_verify_data(verify_data,sched,binder_key);
                    if (iVar6 == 0) {
                      iVar7 = (*ptls_mem_equal)((ch->psk).identities.list[*psk_index].binder.base,
                                                verify_data,
                                                (tls->key_schedule->hashes[0].algo)->digest_size);
                      iVar6 = 0x33;
                      if (iVar7 != 0) {
                        iVar6 = 0;
                      }
                    }
                  }
                  goto LAB_00113cbd;
                }
                break;
              }
              ppVar5 = *pppVar9;
            }
          }
        }
        else if (pcVar4 != (char *)0x0) {
          local_248 = (char *)ticket_server_name.len;
          iVar6 = strncmp((char *)ticket_server_name.base,pcVar4,ticket_server_name.len);
          if ((iVar6 == 0) && (pcVar4[(long)local_248] == '\0')) goto LAB_00113bc3;
        }
      }
      uVar8 = *psk_index + 1;
      *psk_index = uVar8;
    } while (uVar8 < (ch->psk).identities.count);
  }
  *psk_index = 0xffffffffffffffff;
  *local_238 = 0;
  tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
  iVar6 = 0;
LAB_00113cbd:
  (*ptls_clear_memory)(decbuf.base,decbuf.off);
  if (decbuf.is_allocated != 0) {
    free(decbuf.base);
  }
  decbuf.off = 0;
  decbuf.is_allocated = 0;
  decbuf._28_4_ = 0;
  decbuf.base = (uint8_t *)0x0;
  decbuf.capacity = 0;
  (*ptls_clear_memory)(binder_key,0x40);
  (*ptls_clear_memory)(verify_data,0x40);
  return iVar6;
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t ticket_psk, ticket_server_name, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t decbuf_small[256], binder_key[PTLS_MAX_DIGEST_SIZE], verify_data[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        struct st_ptls_client_hello_psk_t *identity = ch->psk.identities.list + *psk_index;
        /* decrypt and decode */
        decbuf.off = 0;
        if ((tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) != 0)
            continue;
        if (decode_session_identifier(&issue_at, &ticket_psk, &age_add, &ticket_server_name, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check server-name */
        if (ticket_server_name.len != 0) {
            if (tls->server_name == NULL)
                continue;
            if (!vec_is_string(ticket_server_name, tls->server_name))
                continue;
        } else {
            if (tls->server_name != NULL)
                continue;
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (ticket_psk.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if ((ret = key_schedule_extract(tls->key_schedule, ticket_psk)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, binder_key, "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len);
    if ((ret = calc_verify_data(verify_data, tls->key_schedule, binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, verify_data,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    ptls_clear_memory(verify_data, sizeof(verify_data));
    return ret;
}